

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void SetTexture(sector_t_conflict *sector,int index,int position,char *name,
               FMissingTextureTracker *track,bool truncate)

{
  int iVar1;
  FTextureID FVar2;
  FMissingCount *pFVar3;
  long lVar4;
  undefined3 in_register_00000089;
  char *__dest;
  char name8 [9];
  FString local_48;
  char local_39 [8];
  undefined1 local_31;
  
  __dest = name;
  if (CONCAT31(in_register_00000089,truncate) != 0) {
    __dest = local_39;
    strncpy(__dest,name,8);
    local_31 = 0;
  }
  FVar2 = FTextureManager::CheckForTexture(&TexMan,__dest,2,3);
  lVar4 = (long)position;
  if (FVar2.texnum < 0) {
    FString::FString(&local_48,__dest);
    pFVar3 = TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::
             operator[](track,&local_48);
    iVar1 = pFVar3->Count;
    pFVar3->Count = iVar1 + 1;
    FString::~FString(&local_48);
    FVar2 = TexMan.DefaultTexture;
    if (iVar1 < 0x14) {
      Printf("\x1cGUnknown %s texture \'\x1cI%s\x1cG\' in sector %d\n",
             (long)&
                   _ZZ10SetTextureP8sector_tiiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEbE13positionnames_rel
             + (long)*(int *)((long)&
                                    _ZZ10SetTextureP8sector_tiiPKcR4TMapI7FString13FMissingCount11THashTraitsIS4_E12TValueTraitsIS5_EEbE13positionnames_rel
                             + lVar4 * 4),__dest,(ulong)(uint)index);
      FVar2 = TexMan.DefaultTexture;
    }
  }
  iVar1 = sector->planes[lVar4].Texture.texnum;
  sector->planes[lVar4].Texture.texnum = FVar2.texnum;
  if ((position == 0) && (iVar1 != FVar2.texnum)) {
    sector_t::AdjustFloorClip((sector_t *)sector);
  }
  return;
}

Assistant:

void SetTexture (sector_t *sector, int index, int position, const char *name, FMissingTextureTracker &track, bool truncate)
{
	static const char *positionnames[] = { "floor", "ceiling" };
	char name8[9];
	if (truncate)
	{
		strncpy(name8, name, 8);
		name8[8] = 0;
		name = name8;
	}

	FTextureID texture = TexMan.CheckForTexture (name, FTexture::TEX_Flat,
			FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_TryAny);

	if (!texture.Exists())
	{
		if (++track[name].Count <= MISSING_TEXTURE_WARN_LIMIT)
		{
			Printf(TEXTCOLOR_RED"Unknown %s texture '"
				TEXTCOLOR_ORANGE "%s" TEXTCOLOR_RED
				"' in sector %d\n",
				positionnames[position], name, index);
		}
		texture = TexMan.GetDefaultTexture();
	}
	sector->SetTexture(position, texture);
}